

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O0

void __thiscall duckdb::ColumnScanState::Next(ColumnScanState *this,idx_t count)

{
  bool bVar1;
  ColumnScanState *in_RSI;
  vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_> *in_RDI;
  ColumnScanState *child_state;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::ColumnScanState,_true> *__range1;
  reference in_stack_ffffffffffffffd0;
  idx_t in_stack_ffffffffffffffd8;
  __normal_iterator<duckdb::ColumnScanState_*,_std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>_>
  in_stack_ffffffffffffffe0;
  pointer *count_00;
  
  NextInternal(in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8);
  count_00 = &in_RDI[1].
              super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::begin(in_RDI);
  ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::ColumnScanState_*,_std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<duckdb::ColumnScanState_*,_std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<duckdb::ColumnScanState_*,_std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>_>
         ::operator*((__normal_iterator<duckdb::ColumnScanState_*,_std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>_>
                      *)&stack0xffffffffffffffe0);
    Next(in_RSI,(idx_t)count_00);
    __gnu_cxx::
    __normal_iterator<duckdb::ColumnScanState_*,_std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>_>
    ::operator++((__normal_iterator<duckdb::ColumnScanState_*,_std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void ColumnScanState::Next(idx_t count) {
	NextInternal(count);
	for (auto &child_state : child_states) {
		child_state.Next(count);
	}
}